

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall
lest::unexpected::unexpected(unexpected *this,location *where_,text *expr_,text *note_)

{
  location *in_RDX;
  location *in_RSI;
  undefined8 *in_RDI;
  allocator<char> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  text *in_stack_ffffffffffffff80;
  text *in_stack_ffffffffffffff88;
  location *in_stack_ffffffffffffff90;
  text *in_stack_ffffffffffffff98;
  message *in_stack_ffffffffffffffa0;
  allocator<char> local_41 [65];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  location::location(in_RDX,in_RSI);
  std::__cxx11::string::string(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__cxx11::string::string(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  message::message(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                   in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::__cxx11::string::~string(&in_RDX->file);
  std::__cxx11::string::~string(&in_RDX->file);
  location::~location((location *)0x129702);
  std::__cxx11::string::~string(&in_RDX->file);
  std::allocator<char>::~allocator(local_41);
  *in_RDI = &PTR__unexpected_00135d88;
  return;
}

Assistant:

unexpected( location where_, text expr_, text note_ = "" )
    : message( "failed: got unexpected exception", where_, expr_, note_) {}